

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *recorder,Hasher *h,VkPipelineLibraryCreateInfoKHR *info)

{
  bool bVar1;
  uint local_34;
  uint64_t uStack_30;
  uint32_t i;
  Hash hash;
  VkPipelineLibraryCreateInfoKHR *info_local;
  Hasher *h_local;
  StateRecorder *recorder_local;
  
  uStack_30 = 0;
  hash = (Hash)info;
  info_local = (VkPipelineLibraryCreateInfoKHR *)h;
  h_local = (Hasher *)recorder;
  Hasher::u32(h,info->libraryCount);
  local_34 = 0;
  while( true ) {
    if (*(uint *)(hash + 0x10) <= local_34) {
      return true;
    }
    bVar1 = StateRecorder::get_hash_for_pipeline_library_handle
                      ((StateRecorder *)h_local,
                       *(VkPipeline *)(*(long *)(hash + 0x18) + (ulong)local_34 * 8),
                       &stack0xffffffffffffffd0);
    if (!bVar1) break;
    Hasher::u64((Hasher *)info_local,uStack_30);
    local_34 = local_34 + 1;
  }
  return false;
}

Assistant:

static bool hash_pnext_struct(const StateRecorder *recorder,
                              Hasher &h,
                              const VkPipelineLibraryCreateInfoKHR &info)
{
	Hash hash = 0;
	h.u32(info.libraryCount);

	for (uint32_t i = 0; i < info.libraryCount; i++)
	{
		if (!recorder->get_hash_for_pipeline_library_handle(info.pLibraries[i], &hash))
			return false;
		h.u64(hash);
	}

	return true;
}